

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::
     log<char_const(&)[200],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [200],
               DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *params_1,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2
               ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  pointer pcVar1;
  size_t sVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  ArrayPtr<kj::String> argValues;
  undefined4 in_register_00000014;
  DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *params_00;
  long lVar6;
  String *result;
  String local_98;
  String local_80;
  String local_68;
  String local_50;
  
  str<char_const(&)[200]>
            (&local_98,(kj *)params,(char (*) [200])CONCAT44(in_register_00000014,severity));
  str<kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&>
            (&local_80,(kj *)params_1,params_00);
  pcVar1 = (params_2->_M_dataplus)._M_p;
  sVar2 = params_2->_M_string_length;
  heapString(&local_68,sVar2);
  if (sVar2 != 0) {
    if ((char *)local_68.content.size_ != (char *)0x0) {
      local_68.content.size_ = (size_t)local_68.content.ptr;
    }
    memcpy((void *)local_68.content.size_,pcVar1,sVar2);
  }
  pcVar1 = (params_3->_M_dataplus)._M_p;
  sVar2 = params_3->_M_string_length;
  heapString(&local_50,sVar2);
  if (sVar2 != 0) {
    if ((char *)local_50.content.size_ != (char *)0x0) {
      local_50.content.size_ = (size_t)local_50.content.ptr;
    }
    memcpy((void *)local_50.content.size_,pcVar1,sVar2);
  }
  argValues.ptr._4_4_ = severity;
  argValues.ptr._0_4_ = line;
  argValues.size_ = (size_t)macroArgs;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_98,argValues);
  lVar6 = 0x48;
  do {
    lVar3 = *(long *)((long)&local_98.content.ptr + lVar6);
    if (lVar3 != 0) {
      uVar4 = *(undefined8 *)((long)&local_98.content.size_ + lVar6);
      *(undefined8 *)((long)&local_98.content.ptr + lVar6) = 0;
      *(undefined8 *)((long)&local_98.content.size_ + lVar6) = 0;
      puVar5 = *(undefined8 **)((long)&local_98.content.disposer + lVar6);
      (**(code **)*puVar5)(puVar5,lVar3,1,uVar4,uVar4,0);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}